

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack3_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 7;
  out[1] = *in >> 3 & 7;
  out[2] = *in >> 6 & 7;
  out[3] = *in >> 9 & 7;
  out[4] = *in >> 0xc & 7;
  out[5] = *in >> 0xf & 7;
  out[6] = *in >> 0x12 & 7;
  out[7] = *in >> 0x15 & 7;
  out[8] = *in >> 0x18 & 7;
  out[9] = *in >> 0x1b & 7;
  puVar1 = out + 10;
  *puVar1 = *in >> 0x1e;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 1) << 2 | *puVar1;
  out[0xb] = *puVar2 >> 1 & 7;
  out[0xc] = *puVar2 >> 4 & 7;
  out[0xd] = *puVar2 >> 7 & 7;
  out[0xe] = *puVar2 >> 10 & 7;
  out[0xf] = *puVar2 >> 0xd & 7;
  out[0x10] = *puVar2 >> 0x10 & 7;
  out[0x11] = *puVar2 >> 0x13 & 7;
  out[0x12] = *puVar2 >> 0x16 & 7;
  out[0x13] = *puVar2 >> 0x19 & 7;
  out[0x14] = *puVar2 >> 0x1c & 7;
  puVar1 = out + 0x15;
  *puVar1 = *puVar2 >> 0x1f;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 3) << 1 | *puVar1;
  out[0x16] = *puVar2 >> 2 & 7;
  out[0x17] = *puVar2 >> 5 & 7;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack3_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 3);
  out++;
  *out = ((*in) >> 3) % (1U << 3);
  out++;
  *out = ((*in) >> 6) % (1U << 3);
  out++;
  *out = ((*in) >> 9) % (1U << 3);
  out++;
  *out = ((*in) >> 12) % (1U << 3);
  out++;
  *out = ((*in) >> 15) % (1U << 3);
  out++;
  *out = ((*in) >> 18) % (1U << 3);
  out++;
  *out = ((*in) >> 21) % (1U << 3);
  out++;
  *out = ((*in) >> 24) % (1U << 3);
  out++;
  *out = ((*in) >> 27) % (1U << 3);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 1)) << (3 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 3);
  out++;
  *out = ((*in) >> 4) % (1U << 3);
  out++;
  *out = ((*in) >> 7) % (1U << 3);
  out++;
  *out = ((*in) >> 10) % (1U << 3);
  out++;
  *out = ((*in) >> 13) % (1U << 3);
  out++;
  *out = ((*in) >> 16) % (1U << 3);
  out++;
  *out = ((*in) >> 19) % (1U << 3);
  out++;
  *out = ((*in) >> 22) % (1U << 3);
  out++;
  *out = ((*in) >> 25) % (1U << 3);
  out++;
  *out = ((*in) >> 28) % (1U << 3);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 2)) << (3 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 3);
  out++;
  *out = ((*in) >> 5) % (1U << 3);
  out++;

  return in + 1;
}